

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall backward::Printer::Printer(Printer *this)

{
  TraceResolver *in_RDI;
  
  *(undefined1 *)
   &(in_RDI->super_TraceResolverImpl<backward::system_tag::linux_tag>).
    super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
    super_TraceResolverLinuxBase.super_TraceResolverImplBase._vptr_TraceResolverImplBase = 1;
  *(undefined4 *)
   ((long)&(in_RDI->super_TraceResolverImpl<backward::system_tag::linux_tag>).
           super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
           super_TraceResolverLinuxBase.super_TraceResolverImplBase._vptr_TraceResolverImplBase + 4)
       = 0;
  *(undefined1 *)
   &(in_RDI->super_TraceResolverImpl<backward::system_tag::linux_tag>).
    super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
    super_TraceResolverLinuxBase.super_TraceResolverImplBase._demangler.
    super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._val = 0;
  *(undefined1 *)
   ((long)&(in_RDI->super_TraceResolverImpl<backward::system_tag::linux_tag>).
           super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
           super_TraceResolverLinuxBase.super_TraceResolverImplBase._demangler.
           super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer + 1) = 0;
  *(undefined4 *)
   ((long)&(in_RDI->super_TraceResolverImpl<backward::system_tag::linux_tag>).
           super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
           super_TraceResolverLinuxBase.super_TraceResolverImplBase._demangler.
           super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer + 4) = 5;
  *(undefined4 *)
   ((long)&(in_RDI->super_TraceResolverImpl<backward::system_tag::linux_tag>).
           super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
           super_TraceResolverLinuxBase.super_TraceResolverImplBase._demangler.
           super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer + 8) = 7;
  TraceResolver::TraceResolver(in_RDI);
  SnippetFactory::SnippetFactory((SnippetFactory *)0x111efd);
  return;
}

Assistant:

Printer()
      : snippet(true), color_mode(ColorMode::automatic), address(false),
        object(false), inliner_context_size(5), trace_context_size(7) {}